

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O1

_Bool store_purchase(store_context *ctx,wchar_t item,_Bool single)

{
  store *store;
  object *obj;
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  command_conflict *pcVar8;
  char *pcVar9;
  undefined7 in_register_00000011;
  char *pcVar10;
  wchar_t unaff_R15D;
  ulong uVar11;
  object *dummy;
  char o_name [80];
  object *local_90;
  char local_88 [88];
  
  store = ctx->store;
  obj = ctx->list[item];
  local_90 = (object *)0x0;
  msg_flag = false;
  pcVar10 = "";
  prt("",L'\0',L'\0');
  _Var2 = store_is_home(store);
  if ((int)CONCAT71(in_register_00000011,single) != 0) {
    unaff_R15D = L'\x01';
    if (!_Var2) {
      wVar7 = player->au;
      unaff_R15D = L'\x01';
      wVar4 = price_item(store,obj,false,L'\x01');
      if (wVar7 < wVar4) {
        msg("You do not have enough gold for this item.");
        return false;
      }
    }
    goto LAB_00207d58;
  }
  if (_Var2) {
    uVar11 = (ulong)obj->number;
LAB_00207c68:
    wVar7 = inven_carry_num(player,obj);
    if (wVar7 < (wchar_t)uVar11) {
      wVar7 = inven_carry_num(player,obj);
      uVar11 = (ulong)(uint)wVar7;
    }
    _Var2 = object_flavor_is_aware(obj);
    unaff_R15D = (wchar_t)uVar11;
    if (unaff_R15D < L'\x01') {
LAB_00207cb5:
      bVar1 = false;
      msg("You cannot carry that many items.");
    }
    else {
      if (_Var2) goto LAB_00207cdc;
      _Var3 = store_is_home(store);
      if ((!_Var3) && (_Var3 = pack_is_full(), _Var3)) goto LAB_00207cb5;
      if (_Var2) {
LAB_00207cdc:
        wVar7 = find_inven(obj);
      }
      else {
        _Var2 = store_is_home(store);
        wVar7 = L'\0';
        if (_Var2) goto LAB_00207cdc;
      }
      _Var2 = store_is_home(store);
      pcVar9 = "Buy";
      if (_Var2) {
        pcVar9 = "Take";
      }
      if (wVar7 != L'\0') {
        pcVar10 = format(" (you have %d)",(ulong)(uint)wVar7);
      }
      strnfmt(local_88,0x50,"%s how many%s? (max %d) ",pcVar9,pcVar10,uVar11);
      unaff_R15D = get_quantity(local_88,unaff_R15D);
      bVar1 = L'\0' < unaff_R15D;
    }
  }
  else {
    wVar4 = price_item(store,obj,false,L'\x01');
    wVar7 = player->au;
    if ((uint)wVar4 <= (uint)wVar7) {
      if (wVar4 == L'\0') {
        uVar5 = (uint)obj->number;
      }
      else {
        uVar5 = wVar7 / wVar4;
      }
      uVar11 = (ulong)obj->number;
      if ((int)uVar5 < (int)(uint)obj->number) {
        uVar11 = (ulong)uVar5;
      }
      wVar4 = (wchar_t)uVar11;
      wVar6 = price_item(store,obj,false,wVar4 + L'\x01');
      if (wVar6 <= wVar7) {
        wVar7 = wVar4 + L'\x01';
        if ((int)(uint)obj->number <= wVar4) {
          wVar7 = wVar4;
        }
        uVar11 = (ulong)(uint)wVar7;
      }
      goto LAB_00207c68;
    }
    bVar1 = false;
    msg("You do not have enough gold for this item.");
  }
  if (!bVar1) {
    return false;
  }
LAB_00207d58:
  local_90 = object_new();
  object_copy_amt(local_90,obj,unaff_R15D);
  _Var2 = inven_carry_okay(local_90);
  if (_Var2) {
    _Var2 = store_is_home(store);
    if (_Var2) {
      cmdq_push(CMD_RETRIEVE);
      pcVar8 = cmdq_peek();
      cmd_set_arg_item(pcVar8,"item",obj);
    }
    else {
      _Var2 = tval_is_book_k(obj->kind);
      if (_Var2) {
        _Var2 = obj_can_browse(obj);
        pcVar10 = " (Can\'t use!)";
        if (_Var2) {
          pcVar10 = "";
        }
      }
      else {
        pcVar10 = "";
      }
      object_desc(local_88,0x50,local_90,0x47,player);
      wVar7 = price_item(store,local_90,false,(uint)local_90->number);
      screen_save();
      pcVar9 = format("Price: %ld",(long)wVar7);
      prt(pcVar9,L'\x01',L'\0');
      pcVar10 = format("Buy %s?%s %s",local_88,pcVar10,"[ESC, any other key to accept]");
      _Var2 = store_get_check(pcVar10);
      screen_load();
      if (!_Var2) {
        return false;
      }
      cmdq_push(CMD_BUY);
      pcVar8 = cmdq_peek();
      cmd_set_arg_item(pcVar8,"item",obj);
    }
    pcVar8 = cmdq_peek();
    cmd_set_arg_number(pcVar8,"quantity",unaff_R15D);
    *(byte *)&ctx->flags = (byte)ctx->flags | 1;
    object_delete((chunk *)0x0,(chunk *)0x0,&local_90);
    _Var2 = true;
  }
  else {
    _Var2 = false;
    msg("You cannot carry that many items.");
    object_delete((chunk *)0x0,(chunk *)0x0,&local_90);
  }
  return _Var2;
}

Assistant:

static bool store_purchase(struct store_context *ctx, int item, bool single)
{
	struct store *store = ctx->store;

	struct object *obj = ctx->list[item];
	struct object *dummy = NULL;

	char o_name[80];

	int amt, num;

	int32_t price;

	/* Clear all current messages */
	msg_flag = false;
	prt("", 0, 0);


	/*** Check the player can get any at all ***/

	/* Get an amount if we weren't given one */
	if (single) {
		amt = 1;

		/* Check if the player can afford any at all */
		if (!store_is_home(store) &&
				player->au < price_item(store, obj, false, 1)) {
			msg("You do not have enough gold for this item.");
			return false;
		}
	} else {
		bool flavor_aware;

		if (store_is_home(store)) {
			amt = obj->number;
		} else {
			/* Price of one */
			price = price_item(store, obj, false, 1);

			/* Check if the player can afford any at all */
			if ((uint32_t)player->au < (uint32_t)price) {
				msg("You do not have enough gold for this item.");
				return false;
			}

			/* Work out how many the player can afford */
			if (price == 0)
				amt = obj->number; /* Prevent division by zero */
			else
				amt = player->au / price;

			if (amt > obj->number) amt = obj->number;

			/* Double check for wands/staves */
			if ((player->au >= price_item(store, obj, false, amt+1)) &&
				(amt < obj->number))
				amt++;
		}

		/* Limit to the number that can be carried */
		amt = MIN(amt, inven_carry_num(player, obj));

		/* Fail if there is no room.  Don't leak information about
		 * unknown flavors for a purchase (getting it from home doesn't
		 * leak information since it doesn't show the true flavor). */
		flavor_aware = object_flavor_is_aware(obj);
		if (amt <= 0 || (!flavor_aware && !store_is_home(store) &&
						 pack_is_full())) {
			msg("You cannot carry that many items.");
			return false;
		}

		/* Find the number of this item in the inventory.  As above,
		 * avoid leaking information about unknown flavors. */
		if (!flavor_aware && !store_is_home(store))
			num = 0;
		else
			num = find_inven(obj);

		strnfmt(o_name, sizeof o_name, "%s how many%s? (max %d) ",
				(store_is_home(store)) ? "Take" : "Buy",
				num ? format(" (you have %d)", num) : "", amt);

		/* Get a quantity */
		amt = get_quantity(o_name, amt);

		/* Allow user abort */
		if (amt <= 0) return false;
	}

	/* Get desired object */
	dummy = object_new();
	object_copy_amt(dummy, obj, amt);

	/* Ensure we have room */
	if (!inven_carry_okay(dummy)) {
		msg("You cannot carry that many items.");
		object_delete(NULL, NULL, &dummy);
		return false;
	}

	/* Attempt to buy it */
	if (!store_is_home(store)) {
		bool response;

		bool obj_is_book = tval_is_book_k(obj->kind);
		bool obj_can_use = !obj_is_book || obj_can_browse(obj);

		/* Describe the object (fully) */
		object_desc(o_name, sizeof(o_name), dummy,
			ODESC_PREFIX | ODESC_FULL | ODESC_STORE, player);

		/* Extract the price for the entire stack */
		price = price_item(store, dummy, false, dummy->number);

		screen_save();

		/* Show price */
		prt(format("Price: %ld", (long)price), 1, 0);

		/* Confirm purchase */
		response = store_get_check(format("Buy %s?%s %s",
					o_name,
					obj_can_use ? "" : " (Can't use!)",
					"[ESC, any other key to accept]"));

		screen_load();

		/* Negative response, so give up */
		if (!response) return false;

		cmdq_push(CMD_BUY);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	} else {
		/* Home is much easier */
		cmdq_push(CMD_RETRIEVE);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
		cmd_set_arg_number(cmdq_peek(), "quantity", amt);
	}

	/* Update the display */
	ctx->flags |= STORE_GOLD_CHANGE;

	object_delete(NULL, NULL, &dummy);

	/* Not kicked out */
	return true;
}